

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gd.cc
# Opt level: O3

float GD::sensitivity<true,true,true,0ul,0ul,0ul>(gd *g,base_learner *param_2,example *ec)

{
  float fVar1;
  shared_data *psVar2;
  float fVar3;
  
  psVar2 = g->all->sd;
  fVar1 = g->all->eta;
  fVar3 = powf((float)((psVar2->t + 1.0) - psVar2->weighted_holdout_examples),g->neg_power_t);
  return fVar3 * fVar1 * ec->total_sum_feat_sq;
}

Assistant:

float sensitivity(gd& g, base_learner& /* base */, example& ec)
{
  return get_scale<adaptive>(g, ec, 1.) *
      sensitivity<sqrt_rate, feature_mask_off, adax, adaptive, normalized, spare, true>(g, ec);
}